

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# break_on_failure_nobreak_tests.cpp
# Opt level: O2

void __thiscall iu_Foo_x_iutest_x_Skip_Test::Body(iu_Foo_x_iutest_x_Skip_Test *this)

{
  bool bVar1;
  char *message;
  iuCodeMessage local_1c0;
  Fixed local_190;
  
  memset(&local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  bVar1 = iutest::UnitTestImpl::SkipTest();
  message = "Skipped. but already failed. ";
  if (bVar1) {
    message = "Skipped. ";
  }
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/break_on_failure_nobreak_tests.cpp"
             ,0x16,message);
  local_1c0._44_4_ = 0xfffffffe;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,&local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_190);
  return;
}

Assistant:

IUTEST(Foo, Skip)
{
    IUTEST_SKIP();
}